

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

FileOptions * __thiscall ApprovalTests::Options::fileOptions(Options *this)

{
  logic_error *this_00;
  int in_ECX;
  void *in_RDX;
  Options *in_RSI;
  FileOptions *in_RDI;
  void *in_R8;
  FileOptions *copy;
  
  if ((in_RSI->fileOptions_).options_ == (Options *)0x0) {
    FileOptions::clone(in_RDI,(__fn *)in_RSI,in_RDX,in_ECX,in_R8);
    in_RDI->options_ = in_RSI;
    return in_RDI;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"Incorrect assumption: A FileOptions has been re-used");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

Options::FileOptions Options::fileOptions() const
    {
        if (fileOptions_.options_ != nullptr)
        {
            throw std::logic_error(
                "Incorrect assumption: A FileOptions has been re-used");
        }
        FileOptions copy = fileOptions_.clone();
        copy.options_ = this;
        return copy;
    }